

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O0

bool s2shapeutil::EncodeTaggedShapes
               (S2ShapeIndex *index,ShapeEncoder *shape_encoder,Encoder *encoder)

{
  bool bVar1;
  ostream *poVar2;
  ShapeIterator SVar3;
  S2LogMessage local_f0;
  uint local_dc;
  Encoder *pEStack_d8;
  uint32 tag;
  Encoder *sub_encoder;
  S2Shape *shape;
  int iStack_c0;
  S2Shape *local_b0;
  int local_a8;
  S2Shape *pSStack_a0;
  ShapeIterator __end1;
  undefined1 local_70 [8];
  ShapeIterator __begin1;
  S2ShapeIndex *__range1;
  StringVectorEncoder shape_vector;
  Encoder *encoder_local;
  ShapeEncoder *shape_encoder_local;
  S2ShapeIndex *index_local;
  
  shape_vector.data_.orig_ = (uchar *)encoder;
  s2coding::StringVectorEncoder::StringVectorEncoder((StringVectorEncoder *)&__range1);
  __begin1._8_8_ = index;
  SVar3 = S2ShapeIndex::begin(index);
  __end1._8_8_ = SVar3.index_;
  __begin1.index_._0_4_ = SVar3.shape_id_;
  local_70 = (undefined1  [8])__end1._8_8_;
  SVar3 = S2ShapeIndex::end((S2ShapeIndex *)__begin1._8_8_);
  local_b0 = (S2Shape *)SVar3.index_;
  local_a8 = SVar3.shape_id_;
  pSStack_a0 = local_b0;
  __end1.index_._0_4_ = local_a8;
  do {
    shape = pSStack_a0;
    iStack_c0 = (int)__end1.index_;
    SVar3.shape_id_ = (int)__end1.index_;
    SVar3.index_ = (S2ShapeIndex *)pSStack_a0;
    SVar3._12_4_ = 0;
    bVar1 = S2ShapeIndex::ShapeIterator::operator!=((ShapeIterator *)local_70,SVar3);
    if (!bVar1) {
      s2coding::StringVectorEncoder::Encode
                ((StringVectorEncoder *)&__range1,(Encoder *)shape_vector.data_.orig_);
      s2coding::StringVectorEncoder::~StringVectorEncoder((StringVectorEncoder *)&__range1);
      return true;
    }
    sub_encoder = (Encoder *)S2ShapeIndex::ShapeIterator::operator*((ShapeIterator *)local_70);
    pEStack_d8 = s2coding::StringVectorEncoder::AddViaEncoder((StringVectorEncoder *)&__range1);
    if (sub_encoder != (Encoder *)0x0) {
      local_dc = (**(code **)(sub_encoder->buf_ + 0x50))();
      if (local_dc == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_f0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_coding.cc"
                   ,0xa8,kFatal,(ostream *)&std::cerr);
        poVar2 = S2LogMessage::stream(&local_f0);
        poVar2 = std::operator<<(poVar2,"Unsupported S2Shape type: ");
        std::ostream::operator<<(poVar2,local_dc);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_f0);
      }
      Encoder::Ensure(pEStack_d8,5);
      Encoder::put_varint32(pEStack_d8,local_dc);
      std::function<bool_(const_S2Shape_&,_Encoder_*)>::operator()
                (shape_encoder,(S2Shape *)sub_encoder,pEStack_d8);
    }
    S2ShapeIndex::ShapeIterator::operator++((ShapeIterator *)local_70);
  } while( true );
}

Assistant:

bool EncodeTaggedShapes(const S2ShapeIndex& index,
                        const ShapeEncoder& shape_encoder,
                        Encoder* encoder) {
  s2coding::StringVectorEncoder shape_vector;
  for (S2Shape* shape : index) {
    Encoder* sub_encoder = shape_vector.AddViaEncoder();
    if (shape == nullptr) continue;  // Encode as zero bytes.

    uint32 tag = shape->type_tag();
    if (tag == S2Shape::kNoTypeTag) {
      S2_LOG(DFATAL) << "Unsupported S2Shape type: " << tag;
      return false;
    }
    sub_encoder->Ensure(Encoder::kVarintMax32);
    sub_encoder->put_varint32(tag);
    shape_encoder(*shape, sub_encoder);
  }
  shape_vector.Encode(encoder);
  return true;
}